

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O2

void writeheader(uchar flag,char *fname,unsigned_short param1,unsigned_short param2,
                unsigned_short param3,FILE *fp)

{
  uchar c;
  int iVar1;
  bool bVar2;
  
  writeword(0x13,fp);
  writebyte('\0',fp);
  parity = '\0';
  writebyte(flag,fp);
  iVar1 = 10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    c = *fname;
    bVar2 = c != '\0';
    if (!bVar2) {
      c = ' ';
    }
    fname = (char *)((uchar *)fname + bVar2);
    writebyte(c,fp);
  }
  writeword((uint)param1,fp);
  writeword((uint)param2,fp);
  writeword((uint)param3,fp);
  writebyte(parity,fp);
  return;
}

Assistant:

static void writeheader(unsigned char flag, const char *fname, unsigned short param1, unsigned short param2, unsigned short param3, FILE *fp) {
	/* Write out the code header file */
	writeword(19, fp);		/* Header len */
	writebyte(0, fp);		/* Header is 0 */
	parity = 0;
	writebyte(flag, fp);	/* Filetype flag */

	const char *ptr = fname;
	for (int i = 0; i < 10; i++) {
		if (*ptr) {
			writebyte(*ptr++, fp);
		} else {
			writebyte(' ', fp);
		}
	}

	writeword(param1, fp);
	writeword(param2, fp);
	writeword(param3, fp);
	writebyte(parity, fp);
}